

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::AppendPolygon(Clipper *this,TEdge *e1,TEdge *e2)

{
  int iVar1;
  int iVar2;
  long lVar3;
  OutRec *outRec1;
  OutRec *outRec2;
  OutPt *pOVar4;
  OutPt *pOVar5;
  OutPt *pp;
  OutPt *pOVar6;
  bool bVar7;
  OutRec *pOVar8;
  _func_int *p_Var9;
  
  lVar3 = *(long *)((long)&this->m_ClipType + (long)this->_vptr_Clipper[-3]);
  outRec1 = *(OutRec **)(lVar3 + (long)e1->OutIdx * 8);
  outRec2 = *(OutRec **)(lVar3 + (long)e2->OutIdx * 8);
  bVar7 = OutRec1RightOfOutRec2(outRec1,outRec2);
  pOVar8 = outRec2;
  if (!bVar7) {
    bVar7 = OutRec1RightOfOutRec2(outRec2,outRec1);
    pOVar8 = outRec1;
    if (!bVar7) {
      pOVar8 = GetLowermostRec(outRec1,outRec2);
    }
  }
  pOVar4 = outRec1->Pts;
  pOVar5 = pOVar4->Prev;
  pp = outRec2->Pts;
  pOVar6 = pp->Prev;
  if (e1->Side == esLeft) {
    if (e2->Side == esLeft) {
      ReversePolyPtLinks(pp);
      pp->Next = pOVar4;
      pOVar4->Prev = pp;
      pOVar5->Next = pOVar6;
      pOVar6->Prev = pOVar5;
      outRec1->Pts = pOVar6;
    }
    else {
      pOVar6->Next = pOVar4;
      pOVar4->Prev = pOVar6;
      pp->Prev = pOVar5;
      pOVar5->Next = pp;
      outRec1->Pts = pp;
    }
  }
  else if (e2->Side == esRight) {
    ReversePolyPtLinks(pp);
    pOVar5->Next = pOVar6;
    pOVar6->Prev = pOVar5;
    pp->Next = pOVar4;
    pOVar4->Prev = pp;
  }
  else {
    pOVar5->Next = pp;
    pp->Prev = pOVar5;
    pOVar4->Prev = pOVar6;
    pOVar6->Next = pOVar4;
  }
  outRec1->BottomPt = (OutPt *)0x0;
  if (pOVar8 == outRec2) {
    if (outRec2->FirstLeft != outRec1) {
      outRec1->FirstLeft = outRec2->FirstLeft;
    }
    outRec1->IsHole = outRec2->IsHole;
  }
  outRec2->Pts = (OutPt *)0x0;
  outRec2->BottomPt = (OutPt *)0x0;
  outRec2->FirstLeft = outRec1;
  iVar1 = e1->OutIdx;
  iVar2 = e2->OutIdx;
  e1->OutIdx = -1;
  e2->OutIdx = -1;
  p_Var9 = (_func_int *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]);
  do {
    p_Var9 = *(_func_int **)(p_Var9 + 0x68);
    if (p_Var9 == (_func_int *)0x0) goto LAB_001166ae;
  } while (*(int *)(p_Var9 + 0x4c) != iVar2);
  *(int *)(p_Var9 + 0x4c) = iVar1;
  *(EdgeSide *)(p_Var9 + 0x3c) = e1->Side;
LAB_001166ae:
  outRec2->Idx = outRec1->Idx;
  return;
}

Assistant:

void Clipper::AppendPolygon(TEdge *e1, TEdge *e2)
{
  //get the start and ends of both output polygons ...
  OutRec *outRec1 = m_PolyOuts[e1->OutIdx];
  OutRec *outRec2 = m_PolyOuts[e2->OutIdx];

  OutRec *holeStateRec;
  if (OutRec1RightOfOutRec2(outRec1, outRec2))
    holeStateRec = outRec2;
  else if (OutRec1RightOfOutRec2(outRec2, outRec1))
    holeStateRec = outRec1;
  else 
    holeStateRec = GetLowermostRec(outRec1, outRec2);

  //get the start and ends of both output polygons and
  //join e2 poly onto e1 poly and delete pointers to e2 ...

  OutPt* p1_lft = outRec1->Pts;
  OutPt* p1_rt = p1_lft->Prev;
  OutPt* p2_lft = outRec2->Pts;
  OutPt* p2_rt = p2_lft->Prev;

  //join e2 poly onto e1 poly and delete pointers to e2 ...
  if(  e1->Side == esLeft )
  {
    if(  e2->Side == esLeft )
    {
      //z y x a b c
      ReversePolyPtLinks(p2_lft);
      p2_lft->Next = p1_lft;
      p1_lft->Prev = p2_lft;
      p1_rt->Next = p2_rt;
      p2_rt->Prev = p1_rt;
      outRec1->Pts = p2_rt;
    } else
    {
      //x y z a b c
      p2_rt->Next = p1_lft;
      p1_lft->Prev = p2_rt;
      p2_lft->Prev = p1_rt;
      p1_rt->Next = p2_lft;
      outRec1->Pts = p2_lft;
    }
  } else
  {
    if(  e2->Side == esRight )
    {
      //a b c z y x
      ReversePolyPtLinks(p2_lft);
      p1_rt->Next = p2_rt;
      p2_rt->Prev = p1_rt;
      p2_lft->Next = p1_lft;
      p1_lft->Prev = p2_lft;
    } else
    {
      //a b c x y z
      p1_rt->Next = p2_lft;
      p2_lft->Prev = p1_rt;
      p1_lft->Prev = p2_rt;
      p2_rt->Next = p1_lft;
    }
  }

  outRec1->BottomPt = 0;
  if (holeStateRec == outRec2)
  {
    if (outRec2->FirstLeft != outRec1)
      outRec1->FirstLeft = outRec2->FirstLeft;
    outRec1->IsHole = outRec2->IsHole;
  }
  outRec2->Pts = 0;
  outRec2->BottomPt = 0;
  outRec2->FirstLeft = outRec1;

  int OKIdx = e1->OutIdx;
  int ObsoleteIdx = e2->OutIdx;

  e1->OutIdx = Unassigned; //nb: safe because we only get here via AddLocalMaxPoly
  e2->OutIdx = Unassigned;

  TEdge* e = m_ActiveEdges;
  while( e )
  {
    if( e->OutIdx == ObsoleteIdx )
    {
      e->OutIdx = OKIdx;
      e->Side = e1->Side;
      break;
    }
    e = e->NextInAEL;
  }

  outRec2->Idx = outRec1->Idx;
}